

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_UMAAL(DisasContext_conflict1 *s,arg_UMAAL *a)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar2;
  ulong uVar3;
  TCGTemp *pTVar4;
  TCGv_i32 bh;
  uintptr_t o;
  TCGv_i32 pTVar5;
  TCGv_i32 var;
  TCGv_i32 var_00;
  TCGContext_conflict1 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar3 = s->features & 8;
  }
  else {
    uVar3 = s->features >> 0x22 & 1;
  }
  if (uVar3 != 0) {
    iVar1 = a->rm;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar4 - (long)s_00);
    load_reg_var(s,var,iVar1);
    iVar1 = a->rn;
    pTVar2 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    var_00 = (TCGv_i32)((long)pTVar4 - (long)pTVar2);
    load_reg_var(s,var_00,iVar1);
    tcg_gen_mulu2_i32_aarch64(s_00,var,var_00,var,var_00);
    bh = tcg_const_i32_aarch64(s_00,0);
    iVar1 = a->ra;
    pTVar2 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar2);
    load_reg_var(s,pTVar5,iVar1);
    tcg_gen_add2_i32_aarch64(s_00,var,var_00,var,var_00,pTVar5,bh);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
    iVar1 = a->rd;
    pTVar2 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar2);
    load_reg_var(s,pTVar5,iVar1);
    tcg_gen_add2_i32_aarch64(s_00,var,var_00,var,var_00,pTVar5,bh);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(bh + (long)s_00));
    store_reg(s,a->ra,var);
    store_reg(s,a->rd,var_00);
  }
  return uVar3 != 0;
}

Assistant:

static bool trans_UMAAL(DisasContext *s, arg_UMAAL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, t2, zero;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    tcg_gen_mulu2_i32(tcg_ctx, t0, t1, t0, t1);
    zero = tcg_const_i32(tcg_ctx, 0);
    t2 = load_reg(s, a->ra);
    tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, zero);
    tcg_temp_free_i32(tcg_ctx, t2);
    t2 = load_reg(s, a->rd);
    tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, zero);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, zero);
    store_reg(s, a->ra, t0);
    store_reg(s, a->rd, t1);
    return true;
}